

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcomapi.c
# Opt level: O0

void jpeg_abort(j_common_ptr cinfo)

{
  long in_RDI;
  int pool;
  undefined4 local_c;
  
  if (*(long *)(in_RDI + 8) != 0) {
    for (local_c = 1; 0 < local_c; local_c = local_c + -1) {
      (**(code **)(*(long *)(in_RDI + 8) + 0x48))(in_RDI,local_c);
    }
    if (*(int *)(in_RDI + 0x20) == 0) {
      *(undefined4 *)(in_RDI + 0x24) = 100;
    }
    else {
      *(undefined4 *)(in_RDI + 0x24) = 200;
      *(undefined8 *)(in_RDI + 400) = 0;
    }
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_abort (j_common_ptr cinfo)
{
  int pool;

  /* Do nothing if called on a not-initialized or destroyed JPEG object. */
  if (cinfo->mem == NULL)
    return;

  /* Releasing pools in reverse order might help avoid fragmentation
   * with some (brain-damaged) malloc libraries.
   */
  for (pool = JPOOL_NUMPOOLS-1; pool > JPOOL_PERMANENT; pool--) {
    (*cinfo->mem->free_pool) (cinfo, pool);
  }

  /* Reset overall state for possible reuse of object */
  if (cinfo->is_decompressor) {
    cinfo->global_state = DSTATE_START;
    /* Try to keep application from accessing now-deleted marker list.
     * A bit kludgy to do it here, but this is the most central place.
     */
    ((j_decompress_ptr) cinfo)->marker_list = NULL;
  } else {
    cinfo->global_state = CSTATE_START;
  }
}